

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

YieldResult * __thiscall
NEST::NESTcalc::GetYieldBetaGR
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,vector<double,_std::allocator<double>_> *ERYieldsParam,double multFact)

{
  bool bVar1;
  size_type sVar2;
  runtime_error *this_00;
  const_reference pvVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Wvalue WVar10;
  double local_128;
  YieldResult result;
  double lux_NexONi;
  double Nph;
  double Ne;
  double Ly;
  double coeff_OL;
  double coeff_Ni;
  double coeff_TI;
  double Qy;
  double m10;
  double m09;
  double m08;
  double m07;
  double m05;
  double m04;
  double m03;
  double m02;
  double m01;
  double Nq;
  double alpha;
  double Wq_eV;
  Wvalue wvalue;
  double multFact_local;
  vector<double,_std::allocator<double>_> *ERYieldsParam_local;
  double dfield_local;
  double density_local;
  double energy_local;
  NESTcalc *this_local;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(ERYieldsParam);
  if (9 < sVar2) {
    dVar4 = VDetector::get_molarMass(this->fdetector);
    bVar1 = VDetector::get_OldW13eV(this->fdetector);
    WVar10 = WorkFunction(density,dVar4,bVar1);
    Wq_eV = WVar10.Wq_eV;
    wvalue.Wq_eV = WVar10.alpha;
    dVar4 = (energy * 1000.0) / Wq_eV;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,0);
    if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,0);
      m02 = *pvVar3;
    }
    else {
      dVar5 = pow(dfield / 73.855,2.0318);
      dVar5 = pow(dVar5 + 1.0,0.41883);
      m02 = -24.4622 / dVar5 + 30.66;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,1);
    if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,1);
      m03 = *pvVar3;
    }
    else {
      m03 = 77.2931084;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,2);
    if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,2);
      m04 = *pvVar3;
    }
    else {
      dVar5 = log10(dfield);
      m04 = dVar5 * 0.13946236 + 0.52561312;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,3);
    if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,3);
      m05 = *pvVar3;
    }
    else {
      dVar5 = pow(dfield / 144.65029656,-2.80532006);
      m05 = 1.00311313 / (dVar5 + 1.0) + 1.82217496;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,4);
    if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,4);
      m07 = *pvVar3;
    }
    else {
      dVar5 = erf(energy * 0.05);
      m07 = (dVar4 / energy) / (wvalue.Wq_eV * dVar5 + 1.0) - m02;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,6);
    if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,6);
      m08 = *pvVar3;
    }
    else {
      dVar5 = pow(dfield / 256.48156448,1.29119251);
      m08 = 91.25015493 / (dVar5 + 1.0) + 7.02921301;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,7);
    if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,7);
      m09 = *pvVar3;
    }
    else {
      m09 = 4.285781736;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,8);
    if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,8);
      m10 = *pvVar3;
    }
    else {
      m10 = 0.3344049589;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,9);
    if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,9);
      Qy = *pvVar3;
    }
    else {
      dVar5 = pow(dfield / 139.26046,-0.65763592);
      Qy = 0.0657813262 / (dVar5 + 1.0) + 0.0508273937;
    }
    dVar5 = pow(energy / m04,m05);
    dVar5 = pow(dVar5 + 1.0,m10);
    dVar6 = pow(energy / m08,m09);
    dVar6 = pow(dVar6 + 1.0,Qy);
    coeff_TI = m02 + (m03 - m02) / dVar5 + m07 + (0.0 - m07) / dVar6;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](ERYieldsParam,5);
    if (*pvVar3 <= 0.0 && *pvVar3 != 0.0) {
      dVar5 = pow(0.3448275862068966,0.3);
      dVar6 = pow(0.3448275862068966,1.4);
      dVar7 = pow(0.3448275862068966,-1.7);
      dVar8 = pow(2.9,1.7);
      dVar8 = log(dVar5 * dVar6 * dVar8 + 1.0);
      dVar9 = pow(density,1.7);
      dVar5 = log(dVar5 * dVar6 * dVar9 + 1.0);
      dVar6 = pow(density,-1.7);
      coeff_TI = (dVar7 / dVar8) * dVar5 * dVar6 * coeff_TI;
      bVar1 = VDetector::get_OldW13eV(this->fdetector);
      if (!bVar1) {
        coeff_TI = coeff_TI * 1.08;
      }
    }
    dVar5 = erf(energy * 0.05);
    result.DeltaT_Scint = wvalue.Wq_eV * dVar5;
    memset(&local_128,0,0x30);
    result.ElectronYield = result.DeltaT_Scint;
    result.ExcitonRatio = 1.0;
    result.ElectricField = -999.0;
    local_128 = (dVar4 / energy - multFact * coeff_TI) * energy;
    result.PhotonYield = multFact * coeff_TI * energy;
    result.Lindhard = dfield;
    (*this->_vptr_NESTcalc[0xb])(energy,Wq_eV,__return_storage_ptr__,this,&local_128);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"ERROR: You need a minimum of 10 nuisance parameters for the mean yields.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

YieldResult
NESTcalc::GetYieldBetaGR(double energy, double density, double dfield,
                         const std::vector<double> &ERYieldsParam, double multFact) {
  
  if (ERYieldsParam.size() < 10) {
    throw std::runtime_error(
        "ERROR: You need a minimum of 10 nuisance parameters for the mean "
        "yields.");
  }

  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;
  double alpha = wvalue.alpha;

  double Nq = energy * 1e3 / Wq_eV, m01, m02, m03, m04, m05, m07, m08, m09, m10;
  if (ERYieldsParam[0] < 0.)
    m01 = 30.66 +
          (6.1978 - 30.66) / pow(1. + pow(dfield / 73.855, 2.0318), 0.41883);
  else
    m01 = ERYieldsParam[0];
  if (ERYieldsParam[1] < 0.)
    m02 = 77.2931084;
  else
    m02 = ERYieldsParam[1];
  if (ERYieldsParam[2] < 0.)
    m03 = log10(dfield) * 0.13946236 + 0.52561312;
  else
    m03 = ERYieldsParam[2];
  if (ERYieldsParam[3] < 0.)
    m04 = 1.82217496 + (2.82528809 - 1.82217496) /
                           (1. + pow(dfield / 144.65029656, -2.80532006));
  else
    m04 = ERYieldsParam[3];
  if (ERYieldsParam[4] < 0.)
    m05 = Nq / energy / (1. + alpha * erf(0.05 * energy)) - m01;
  else
    m05 = ERYieldsParam[4];
  if (ERYieldsParam[6] < 0.)
    m07 = 7.02921301 + (98.27936794 - 7.02921301) /
                           (1. + pow(dfield / 256.48156448, 1.29119251));
  else
    m07 = ERYieldsParam[6];
  if (ERYieldsParam[7] < 0.)
    m08 = 4.285781736;
  else
    m08 = ERYieldsParam[7];
  if (ERYieldsParam[8] < 0.)
    m09 = 0.3344049589;
  else
    m09 = ERYieldsParam[8];
  if (ERYieldsParam[9] < 0.)
    m10 = 0.0508273937 + (0.1166087199 - 0.0508273937) /
                             (1. + pow(dfield / 1.39260460e+02, -0.65763592));
  else
    m10 = ERYieldsParam[9];
  double Qy = m01 + (m02 - m01) / pow((1. + pow(energy / m03, m04)), m09) +
              m05 + (0.0 - m05) / pow((1. + pow(energy / m07, m08)), m10);

  if (ERYieldsParam[5] <
      0.) {  // toggle the density and W corrections, which could override you
    double coeff_TI = pow(1. / DENSITY, 0.3);
    double coeff_Ni = pow(1. / DENSITY, 1.4);
    double coeff_OL = pow(1. / DENSITY, -1.7) /
                      log(1. + coeff_TI * coeff_Ni * pow(DENSITY, 1.7));
    Qy *= coeff_OL * log(1. + coeff_TI * coeff_Ni * pow(density, 1.7)) *
          pow(density, -1.7);
    if (!fdetector->get_OldW13eV()) Qy *= ZurichEXOQ;
  }
  Qy *= multFact;
  double Ly = Nq / energy - Qy;
  double Ne = Qy * energy;
  double Nph = Ly * energy;
  double lux_NexONi = alpha * erf(0.05 * energy);

  YieldResult result{};
  result.PhotonYield = Nph;
  result.ElectronYield = Ne;
  result.ExcitonRatio = lux_NexONi;
  result.Lindhard = 1.;
  result.ElectricField = dfield;
  result.DeltaT_Scint = -999;
  return YieldResultValidity(
      result, energy, Wq_eV);  // everything needed to calculate fluctuations;
}